

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotring.cpp
# Opt level: O1

htEntry * __thiscall HotRingInstance::HotRing::search(HotRing *this,string *key)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  htEntry *phVar7;
  htEntry *phVar8;
  size_t sVar9;
  string *psVar10;
  hrHead *this_00;
  ulong uVar11;
  htEntry compareItem;
  string local_a0;
  htEntry local_80;
  
  sVar5 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&hash_fn_abi_cxx11_,key);
  uVar11 = this->hash_mask;
  sVar1 = this->findcnt;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  uVar6 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
  uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
  htEntry::htEntry(&local_80,key,&local_a0,(htEntry *)0x0,
                   (~uVar11 & sVar5) >>
                   ((byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) &
                   0x3f));
  uVar11 = uVar11 & sVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  this->r = this->r + 1;
  hrHead::inc_counter((this->table).
                      super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar11);
  phVar7 = hrHead::get_head((this->table).
                            super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar11);
  if (phVar7 != (htEntry *)0x0) {
    phVar7 = hrHead::get_head((this->table).
                              super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar11);
    phVar7 = htEntry::get_next(phVar7);
    phVar8 = hrHead::get_head((this->table).
                              super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar11);
    this_00 = (this->table).
              super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar11;
    if (phVar7 != phVar8) {
      phVar7 = hrHead::get_head(this_00);
      bVar3 = hrHead::get_active((this->table).
                                 super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar11);
      if (bVar3) {
        htEntry::inc_counter(phVar7);
      }
      phVar8 = hrHead::get_head((this->table).
                                super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11);
      phVar8 = htEntry::get_next(phVar8);
      do {
        sVar5 = htEntry::get_tag(&local_80);
        sVar9 = htEntry::get_tag(phVar7);
        if (sVar5 == sVar9) {
          psVar10 = htEntry::get_key_abi_cxx11_(phVar7);
          sVar2 = key->_M_string_length;
          if (sVar2 == psVar10->_M_string_length) {
            if (sVar2 != 0) {
              iVar4 = bcmp((key->_M_dataplus)._M_p,(psVar10->_M_dataplus)._M_p,sVar2);
              if (iVar4 != 0) goto LAB_0010337b;
            }
            if (4 < this->r) {
              phVar8 = hrHead::get_head((this->table).
                                        super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar11);
              if (phVar7 != phVar8) {
                bVar3 = hrHead::get_active((this->table).
                                           super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar11);
                if (bVar3) {
                  hotspot_movement(this,uVar11);
                  hrHead::reset_active
                            ((this->table).
                             super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar11);
                  hrHead::reset_counter
                            ((this->table).
                             super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar11);
                }
                else {
                  hrHead::set_active((this->table).
                                     super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar11);
                }
                this->r = 0;
              }
            }
            goto LAB_0010342e;
          }
        }
LAB_0010337b:
        bVar3 = htEntry::operator<(phVar7,&local_80);
        if (bVar3) {
          bVar3 = htEntry::operator<(&local_80,phVar8);
          if (bVar3) goto LAB_0010342b;
        }
        bVar3 = htEntry::operator<(&local_80,phVar8);
        if (bVar3) {
          bVar3 = htEntry::operator<(phVar8,phVar7);
          if (bVar3) goto LAB_0010342b;
        }
        bVar3 = htEntry::operator<(phVar8,phVar7);
        if (bVar3) {
          bVar3 = htEntry::operator<(phVar7,&local_80);
          if (bVar3) goto LAB_0010342b;
        }
        phVar8 = htEntry::get_next(phVar8);
        phVar7 = htEntry::get_next(phVar7);
        this->findcnt = this->findcnt + 1;
      } while( true );
    }
    phVar7 = hrHead::get_head(this_00);
    psVar10 = htEntry::get_key_abi_cxx11_(phVar7);
    sVar2 = psVar10->_M_string_length;
    if (sVar2 == key->_M_string_length) {
      if (sVar2 != 0) {
        iVar4 = bcmp((psVar10->_M_dataplus)._M_p,(key->_M_dataplus)._M_p,sVar2);
        if (iVar4 != 0) goto LAB_0010342b;
      }
      phVar7 = hrHead::get_head((this->table).
                                super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11);
      goto LAB_0010342e;
    }
  }
LAB_0010342b:
  phVar7 = (htEntry *)0x0;
LAB_0010342e:
  sVar5 = this->findcnt + 1;
  this->findcnt = sVar5;
  uVar11 = sVar5 - sVar1;
  uVar6 = this->maxFindcnt;
  if (this->maxFindcnt <= uVar11) {
    uVar6 = uVar11;
  }
  this->maxFindcnt = uVar6;
  if (this->minFindcnt < uVar11) {
    uVar11 = this->minFindcnt;
  }
  this->minFindcnt = uVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.val._M_dataplus._M_p != &local_80.val.field_2) {
    operator_delete(local_80.val._M_dataplus._M_p,local_80.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.key._M_dataplus._M_p != &local_80.key.field_2) {
    operator_delete(local_80.key._M_dataplus._M_p,local_80.key.field_2._M_allocated_capacity + 1);
  }
  return phVar7;
}

Assistant:

htEntry* HotRing::search(const string &key){
        size_t hashValue = hash_fn(key);
        size_t index = hashValue & hash_mask;
        size_t tag = (hashValue & (~hash_mask)) >> __builtin_popcountl(hash_mask);

        htEntry* pre = nullptr;
        htEntry* nxt = nullptr;
        htEntry* res = nullptr;

        size_t precnt = findcnt;
        htEntry compareItem(key, "", nullptr, tag);
        bool hotspotAware = false;

        using namespace std;
        //std::cout << key << " : " << index << std::endl; 

        // 在每R个请求完成之后，我们确定是否启动新一轮采样，设置active状态。
        // 如果第R次访问是热访问，则意味着当前热点标识仍然准确，并且无需触发采样
        ++this->r;
        table[index].inc_counter(); // 整个环的访问数加1

        if(table[index].get_head() == nullptr){ // 环中没有元素
            res = nullptr;
        } else if(table[index].get_head()->get_next() == table[index].get_head()){  // 环中有一个元素
            if(table[index].get_head()->get_key() == key){
                res = table[index].get_head();
                if(r >= R){ // 第一个if可能导致加到等于R时没有任何行为，所以这里h和后面需要大于等于R
                    // 只有一个元素，它本身当然就是热点了，所以不需要触发采样
                    r == 0;
                }
            }
        } else {    // 环中有很多元素
            //cout << "第三个if\n";
            pre = table[index].get_head();

            if(table[index].get_active()){ // 3.2.2，active标志存在才进行采样
                pre->inc_counter(); 
            }
            nxt = table[index].get_head()->get_next();
            while (true) {
                if(compareItem.get_tag() == pre->get_tag() && key == pre->get_key()){
                    res = pre;
                    if(r >= R && pre != table[index].get_head()){   // 第R次访问不是热结点，开启采样;当热点调整的时候重置
                        if(table[index].get_active()){  // 保证在设置后的第R次进行热点调整
                            hotspot_movement(index);    // 其中清空了每个数据项的统计信息
                            table[index].reset_active();
                            table[index].reset_counter();
                        } else {
                            table[index].set_active();
                        }
                        r = 0;
                    }
                    break;
                }

                if (((*pre) < (&compareItem) && (compareItem) < (nxt)) ||       //ordre_i-1 < order_k < order_i
                    ((compareItem) < (nxt) && (*nxt) < (pre))     ||            //order_k < order_i < order_i-1 小于有序环最小值
                    ((*nxt) < (pre) && (*pre) < (&compareItem)))                //order_i < order_i-1 < order_k 大于有序环最大值
                {
                    break;
                }
                nxt = nxt->get_next();
                pre = pre->get_next();
                ++findcnt;
            }
        }
        ++findcnt;  // 在正常的循环的地方递增，也就是向上数两行的作用;这一行的作用是查找成功和查找失败的那一个加1，放上面就得写好多个加1

        set_min_max(findcnt - precnt);
        return res;
    }